

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzerSettings.cpp
# Opt level: O3

void __thiscall ModbusAnalyzerSettings::ModbusAnalyzerSettings(ModbusAnalyzerSettings *this)

{
  Channel *this_00;
  AnalyzerSettingInterfaceNumberList *pAVar1;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceInteger *this_02;
  ulong uVar2;
  char *pcVar3;
  Channel *pCVar4;
  uint uVar5;
  AnalyzerSettingInterfaceChannel *pAVar6;
  AnalyzerSettingInterfaceInteger *pAVar7;
  AnalyzerSettingInterfaceNumberList *pAVar8;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__ModbusAnalyzerSettings_00121d68;
  this_00 = &this->mInputChannel;
  uVar2 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x2580;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mParity = EvenOne;
  this->mInverted = false;
  this->mUseAutobaud = false;
  *(undefined8 *)&this->mModbusMode = 0;
  *(undefined8 *)((long)&(this->mInputChannelInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mBitRateInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mBitsPerTransferInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mShiftOrderInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mParityInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mInvertedInterface)._M_ptr + 4) = 0;
  *(undefined8 *)((long)&(this->mUseAutobaudInterface)._M_ptr + 4) = 0;
  *(undefined4 *)((long)&(this->mModbusModeInterface)._M_ptr + 4) = 0;
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar2);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  pAVar8 = (this->mParityInterface)._M_ptr;
  if (pAVar8 != pAVar1) {
    if (pAVar8 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar8 + 8))();
    }
    (this->mParityInterface)._M_ptr = pAVar1;
    pAVar8 = pAVar1;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar8,"Parity Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mParityInterface)._M_ptr,"Even Parity Bit (default)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mParityInterface)._M_ptr,"Odd Parity Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mParityInterface)._M_ptr,"No Parity Bit, 2 stop bits");
  pcVar3 = "No Parity Bit, 1 stop bit";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (3.0,(char *)(this->mParityInterface)._M_ptr,"No Parity Bit, 1 stop bit");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mParity);
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  pAVar6 = (this->mInputChannelInterface)._M_ptr;
  if (pAVar6 != this_01) {
    if (pAVar6 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar6 + 8))();
    }
    (this->mInputChannelInterface)._M_ptr = this_01;
    pAVar6 = this_01;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar6,"Modbus");
  pCVar4 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mInputChannelInterface)._M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  pAVar8 = (this->mModbusModeInterface)._M_ptr;
  if (pAVar8 != pAVar1) {
    if (pAVar8 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar8 + 8))();
    }
    (this->mModbusModeInterface)._M_ptr = pAVar1;
    pAVar8 = pAVar1;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar8,"Modbus Mode");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mModbusModeInterface)._M_ptr,"RTU - Client");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mModbusModeInterface)._M_ptr,"RTU - Server");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mModbusModeInterface)._M_ptr,"ASCII - Client");
  pcVar3 = "ASCII - Server";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (3.0,(char *)(this->mModbusModeInterface)._M_ptr,"ASCII - Server");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mModbusMode);
  this_02 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar3);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_02);
  pAVar7 = (this->mBitRateInterface)._M_ptr;
  if (pAVar7 != this_02) {
    if (pAVar7 != (AnalyzerSettingInterfaceInteger *)0x0) {
      (**(code **)(*(long *)pAVar7 + 8))();
    }
    (this->mBitRateInterface)._M_ptr = this_02;
    pAVar7 = this_02;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar7,"Bit Rate (Bits/s)");
  AnalyzerSettingInterfaceInteger::SetMax((int)(this->mBitRateInterface)._M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)(this->mBitRateInterface)._M_ptr);
  uVar2 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar2);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  pAVar8 = (this->mInvertedInterface)._M_ptr;
  if (pAVar8 != pAVar1) {
    if (pAVar8 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar8 + 8))();
    }
    (this->mInvertedInterface)._M_ptr = pAVar1;
    pAVar8 = pAVar1;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar8,"Signal Inversion");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mInvertedInterface)._M_ptr,"Non Inverted (Standard)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mInvertedInterface)._M_ptr,"Inverted");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mInverted);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

ModbusAnalyzerSettings::ModbusAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 9600 ),
      mBitsPerTransfer( 8 ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mParity( ModbusAnalyzerEnums::ParityAndStopbits::EvenOne ),
      mInverted( false ),
      mUseAutobaud( false ),
      mModbusMode( ModbusAnalyzerEnums::ModbusRTUClient )
{
    mParityInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mParityInterface->SetTitleAndTooltip( "Parity Bit", "Specify None, Even, or Odd Parity" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::EvenOne, "Even Parity Bit (default)", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::OddOne, "Odd Parity Bit", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::NoneTwo, "No Parity Bit, 2 stop bits", "" );
    mParityInterface->AddNumber( ModbusAnalyzerEnums::ParityAndStopbits::NoneOne, "No Parity Bit, 1 stop bit", "" );
    mParityInterface->SetNumber( mParity );


    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Modbus",
                                                "Modbus" ); // Todo: Change to reflect specific variant of Modbus later in program.
    mInputChannelInterface->SetChannel( mInputChannel );


    mModbusModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mModbusModeInterface->SetTitleAndTooltip( "Modbus Mode", "Specify which mode of Modbus this is" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusRTUClient, "RTU - Client", "Messages are transmitted in binary" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusRTUServer, "RTU - Server", "Messages are transmitted in binary" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusASCIIClient, "ASCII - Client",
                                     "Messages are transmitted in ASCII-readable format" );
    mModbusModeInterface->AddNumber( ModbusAnalyzerEnums::ModbusASCIIServer, "ASCII - Server",
                                     "Messages are transmitted in ASCII-readable format" );
    mModbusModeInterface->SetNumber( mModbusMode );


    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "" );
    mBitRateInterface->SetMax( 6000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );


    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Signal Inversion", "Specify if the serial signal is inverted" );
    mInvertedInterface->AddNumber( false, "Non Inverted (Standard)", "" );
    mInvertedInterface->AddNumber( true, "Inverted", "" );
    mInvertedInterface->SetNumber( mInverted );
    enum Mode
    {
        Normal,
        MpModeRightZeroMeansAddress,
        MpModeRightOneMeansAddress,
        MpModeLeftZeroMeansAddress,
        MpModeLeftOneMeansAddress
    }; // FIXME: unused?


    AddInterface( mInputChannelInterface.get() );
    AddInterface( mModbusModeInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mParityInterface.get() );


    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Modbus", false );
}